

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry_creation.cpp
# Opt level: O2

Ref<embree::SceneGraph::Node>
embree::SceneGraph::createPointSphere
          (Vec3fa *center,float radius,float pointRadius,size_t N,PointSubtype subtype,
          Ref<embree::SceneGraph::MaterialNode> *material)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  pointer pvVar3;
  Vec3fx *pVVar4;
  pointer pvVar5;
  Vec3fa *ptr;
  undefined1 auVar6 [16];
  undefined8 uVar7;
  Node *pNVar8;
  PointSubtype PVar9;
  PointSetNode *this;
  Vec3fx *pVVar10;
  Vec3fa *pVVar11;
  int iVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  long *in_R8;
  ulong uVar16;
  long lVar17;
  RTCGeometryType type;
  uint theta;
  ulong uVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  undefined1 extraout_var [12];
  undefined1 extraout_var_00 [12];
  undefined1 extraout_var_01 [12];
  undefined1 extraout_var_02 [12];
  undefined1 extraout_var_03 [12];
  undefined1 auVar25 [12];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  float fVar30;
  float fVar31;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  float fVar32;
  undefined1 auVar28 [16];
  Vec3fa VVar29;
  float fVar33;
  float fVar34;
  undefined4 in_XMM2_Db;
  float fVar35;
  undefined4 in_XMM2_Dc;
  undefined4 in_XMM2_Dd;
  float phif;
  Ref<embree::SceneGraph::MaterialNode> local_70;
  float local_68;
  PointSubtype local_64;
  float local_60;
  float local_5c;
  Node *local_58;
  vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> local_50;
  
  iVar12 = (int)material;
  type = RTC_GEOMETRY_TYPE_ORIENTED_DISC_POINT;
  if (iVar12 != 2) {
    type = iVar12 == 1 | RTC_GEOMETRY_TYPE_SPHERE_POINT;
  }
  local_5c = pointRadius;
  local_58 = (Node *)center;
  this = (PointSetNode *)::operator_new(0xb0);
  local_70.ptr = (MaterialNode *)*in_R8;
  if (local_70.ptr != (MaterialNode *)0x0) {
    (*((local_70.ptr)->super_Node).super_RefCount._vptr_RefCount[2])();
  }
  PointSetNode::PointSetNode(this,type,&local_70,(BBox1f)0x3f80000000000000,1);
  (*(this->super_Node).super_RefCount._vptr_RefCount[2])(this);
  auVar25 = extraout_var;
  if (local_70.ptr != (MaterialNode *)0x0) {
    (*((local_70.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
    auVar25 = extraout_var_00;
  }
  pvVar3 = (this->positions).
           super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar16 = (ulong)((subtype + DISC) * subtype * 2);
  uVar13 = pvVar3->size_alloced;
  uVar18 = uVar13;
  if ((uVar13 < uVar16) && (uVar15 = uVar13, uVar18 = uVar16, uVar13 != 0)) {
    for (; uVar18 = uVar15, uVar15 < uVar16; uVar15 = uVar15 * 2 + (ulong)(uVar15 * 2 == 0)) {
    }
  }
  if (uVar16 < pvVar3->size_active) {
    pvVar3->size_active = uVar16;
  }
  if (uVar13 == uVar18) {
    pvVar3->size_active = uVar16;
  }
  else {
    pVVar4 = pvVar3->items;
    pVVar10 = (Vec3fx *)alignedMalloc(uVar18 << 4,0x10);
    pvVar3->items = pVVar10;
    lVar17 = 0;
    for (uVar13 = 0; uVar13 < pvVar3->size_active; uVar13 = uVar13 + 1) {
      puVar1 = (undefined8 *)((long)&pVVar4->field_0 + lVar17);
      uVar7 = puVar1[1];
      puVar2 = (undefined8 *)((long)&pvVar3->items->field_0 + lVar17);
      *puVar2 = *puVar1;
      puVar2[1] = uVar7;
      lVar17 = lVar17 + 0x10;
    }
    alignedFree(pVVar4);
    pvVar3->size_active = uVar16;
    pvVar3->size_alloced = uVar18;
    auVar25 = extraout_var_01;
  }
  if (iVar12 == 2) {
    local_50.size_active = 0;
    local_50.size_alloced = 0;
    local_50.items = (Vec3fa *)0x0;
    std::
    vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
    ::emplace_back<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>
              ((vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
                *)&this->normals,&local_50);
    alignedFree(local_50.items);
    pvVar5 = (this->normals).
             super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar13 = pvVar5->size_alloced;
    uVar18 = uVar13;
    if ((uVar13 < uVar16) && (uVar15 = uVar13, uVar18 = uVar16, uVar13 != 0)) {
      for (; uVar18 = uVar15, uVar15 < uVar16; uVar15 = uVar15 * 2 + (ulong)(uVar15 * 2 == 0)) {
      }
    }
    if (uVar16 < pvVar5->size_active) {
      pvVar5->size_active = uVar16;
    }
    if (uVar13 == uVar18) {
      pvVar5->size_active = uVar16;
      auVar25 = extraout_var_02;
    }
    else {
      ptr = pvVar5->items;
      pVVar11 = (Vec3fa *)alignedMalloc(uVar18 << 4,0x10);
      pvVar5->items = pVVar11;
      lVar17 = 0;
      for (uVar13 = 0; uVar13 < pvVar5->size_active; uVar13 = uVar13 + 1) {
        puVar1 = (undefined8 *)((long)&ptr->field_0 + lVar17);
        uVar7 = puVar1[1];
        puVar2 = (undefined8 *)((long)&pvVar5->items->field_0 + lVar17);
        *puVar2 = *puVar1;
        puVar2[1] = uVar7;
        lVar17 = lVar17 + 0x10;
      }
      alignedFree(ptr);
      pvVar5->size_active = uVar16;
      pvVar5->size_alloced = uVar18;
      auVar25 = extraout_var_03;
    }
  }
  uVar13 = (ulong)(subtype * 2);
  auVar23._0_4_ = (float)uVar13;
  auVar23._4_12_ = auVar25;
  auVar26._4_4_ = auVar25._0_4_;
  auVar26._0_4_ = auVar23._0_4_;
  auVar26._8_4_ = auVar25._4_4_;
  auVar26._12_4_ = auVar25._8_4_;
  auVar27 = rcpss(auVar26,auVar23);
  fVar33 = (float)subtype;
  local_60 = (2.0 - auVar23._0_4_ * auVar27._0_4_) * auVar27._0_4_;
  auVar24._4_4_ = in_XMM2_Db;
  auVar24._0_4_ = fVar33;
  auVar24._8_4_ = in_XMM2_Dc;
  auVar24._12_4_ = in_XMM2_Dd;
  auVar27._4_4_ = in_XMM2_Db;
  auVar27._0_4_ = fVar33;
  auVar27._8_4_ = in_XMM2_Dc;
  auVar27._12_4_ = in_XMM2_Dd;
  auVar27 = rcpss(auVar24,auVar27);
  local_68 = (2.0 - fVar33 * auVar27._0_4_) * auVar27._0_4_;
  lVar17 = 0;
  PVar9 = SPHERE;
  while (pNVar8 = local_58, PVar9 <= subtype) {
    fVar33 = (float)PVar9 * 3.1415927 * local_68;
    local_64 = PVar9;
    for (uVar18 = 0; uVar13 != uVar18; uVar18 = uVar18 + 1) {
      fVar19 = ((float)(uVar18 & 0xffffffff) + (float)(uVar18 & 0xffffffff)) * 3.1415927 * local_60;
      fVar22 = *(float *)N;
      fVar20 = sinf(fVar33);
      fVar21 = sinf(fVar19);
      uVar14 = (int)uVar18 + (int)lVar17;
      ((this->positions).
       super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start)->items[uVar14].field_0.m128[0] =
           fVar21 * fVar20 * radius + fVar22;
      fVar22 = *(float *)(N + 4);
      fVar20 = cosf(fVar33);
      ((this->positions).
       super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start)->items[uVar14].field_0.m128[1] =
           fVar20 * radius + fVar22;
      fVar22 = *(float *)(N + 8);
      fVar20 = sinf(fVar33);
      fVar19 = cosf(fVar19);
      ((this->positions).
       super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start)->items[uVar14].field_0.m128[2] =
           fVar20 * radius * fVar19 + fVar22;
      ((this->positions).
       super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start)->items[uVar14].field_0.m128[3] = local_5c;
      if (iVar12 == 2) {
        pVVar4 = ((this->positions).
                  super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->items + uVar14;
        fVar22 = (pVVar4->field_0).m128[0] - *(float *)N;
        fVar19 = (pVVar4->field_0).m128[1] - *(float *)(N + 4);
        fVar20 = (pVVar4->field_0).m128[2] - *(float *)(N + 8);
        fVar21 = (pVVar4->field_0).m128[3] - *(float *)(N + 0xc);
        fVar30 = fVar19 * fVar19;
        fVar31 = fVar20 * fVar20;
        fVar32 = fVar21 * fVar21;
        fVar34 = fVar30 + fVar22 * fVar22 + fVar31;
        fVar35 = fVar30 + fVar30 + fVar32;
        fVar31 = fVar30 + fVar31 + fVar31;
        fVar32 = fVar30 + fVar32 + fVar32;
        auVar28._4_4_ = fVar35;
        auVar28._0_4_ = fVar34;
        auVar28._8_4_ = fVar31;
        auVar28._12_4_ = fVar32;
        auVar6._4_4_ = fVar35;
        auVar6._0_4_ = fVar34;
        auVar6._8_4_ = fVar31;
        auVar6._12_4_ = fVar32;
        auVar27 = rsqrtss(auVar28,auVar6);
        fVar30 = auVar27._0_4_;
        fVar30 = fVar30 * fVar30 * fVar34 * -0.5 * fVar30 + fVar30 * 1.5;
        VVar29.field_0._0_4_ = fVar30 * fVar22;
        VVar29.field_0._4_4_ = fVar30 * fVar19;
        VVar29.field_0._8_4_ = fVar30 * fVar20;
        VVar29.field_0._12_4_ = fVar30 * fVar21;
        ((this->normals).
         super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->items[uVar14].field_0 = VVar29.field_0;
      }
    }
    lVar17 = lVar17 + uVar13;
    PVar9 = local_64 + DISC;
  }
  (local_58->super_RefCount)._vptr_RefCount = (_func_int **)this;
  (*(this->super_Node).super_RefCount._vptr_RefCount[2])(this);
  (*(this->super_Node).super_RefCount._vptr_RefCount[3])(this);
  return (Ref<embree::SceneGraph::Node>)pNVar8;
}

Assistant:

Ref<SceneGraph::Node> SceneGraph::createPointSphere (const Vec3fa& center, const float radius, const float pointRadius,
                                                       size_t N, PointSubtype subtype, Ref<MaterialNode> material)
  {
    unsigned numPhi = unsigned(N);
    unsigned numTheta = 2 * numPhi;
    unsigned numVertices = numTheta * (numPhi + 1);

    RTCGeometryType type;
    switch (subtype) {
      case SPHERE:
        type = RTC_GEOMETRY_TYPE_SPHERE_POINT;
        break;
      case DISC:
        type = RTC_GEOMETRY_TYPE_DISC_POINT;
        break;
      case ORIENTED_DISC:
        type = RTC_GEOMETRY_TYPE_ORIENTED_DISC_POINT;
        break;
    }

    Ref<SceneGraph::PointSetNode> mesh = new SceneGraph::PointSetNode(type, material, BBox1f(0,1), 1);
    mesh->positions[0].resize(numVertices);
    if (subtype == ORIENTED_DISC) {
      mesh->normals.push_back(avector<Vec3fa>());
      mesh->normals[0].resize(numVertices);
    }

    /* create sphere geometry */
    const float rcpNumTheta = rcp(float(numTheta));
    const float rcpNumPhi   = rcp(float(numPhi));
    for (unsigned int phi = 0; phi <= numPhi; phi++)
    {
      for (unsigned int theta = 0; theta < numTheta; theta++)
      {
        const float phif   = phi * float(pi) * rcpNumPhi;
        const float thetaf = theta * 2.0f * float(pi) * rcpNumTheta;
        mesh->positions[0][phi * numTheta + theta].x = center.x + radius * sin(phif) * sin(thetaf);
        mesh->positions[0][phi * numTheta + theta].y = center.y + radius * cos(phif);
        mesh->positions[0][phi * numTheta + theta].z = center.z + radius * sin(phif) * cos(thetaf);
        mesh->positions[0][phi * numTheta + theta].w = pointRadius;
        if (subtype == ORIENTED_DISC)
          mesh->normals[0][phi * numTheta + theta] =
            normalize(mesh->positions[0][phi * numTheta + theta] - center);
      }
    }
    return mesh.dynamicCast<SceneGraph::Node>();
  }